

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_row_access_constructors<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
               (vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                *matrix,map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
                        *rows)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  int iVar3;
  _Base_ptr p_Var4;
  Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
  *pEVar5;
  node_ptr plVar6;
  node_ptr plVar7;
  Index IVar8;
  Index IVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  pointer psVar12;
  pointer ppEVar13;
  pointer ppEVar14;
  pointer ppEVar15;
  bool bVar16;
  _Rb_tree_node_base *p_Var17;
  undefined4 local_2b4;
  undefined *local_2b0;
  undefined4 *local_2a8;
  undefined **local_2a0;
  undefined **local_298;
  ulong local_290;
  shared_count sStack_288;
  undefined4 **local_280;
  char *local_278;
  char *local_270;
  shared_count sStack_268;
  undefined **local_260;
  undefined1 local_258;
  undefined8 *local_250;
  undefined ***local_248;
  undefined4 **local_240;
  char *local_238;
  undefined **local_230;
  char *local_228;
  shared_count sStack_220;
  char *local_218;
  undefined1 local_210 [16];
  pointer psStack_200;
  Index local_1f8;
  pointer local_1f0;
  pointer ppEStack_1e8;
  pointer local_1e0;
  undefined8 uStack_1d8;
  Entry_constructor *pEStack_1d0;
  undefined1 local_1c8 [24];
  undefined4 ***local_1b0;
  pointer local_1a8;
  pointer ppEStack_1a0;
  pointer local_198;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  Entry_constructor *pEStack_188;
  map<unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>,_boost::intrusive::constant_time_size<false>,_boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>::Matrix_row_tag>,_boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>_>_>_>_>_>
  *local_180;
  vector<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
  *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_210,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  build_column_values<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_210,
             (vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
              *)local_1c8);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             *)local_1c8);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_210);
  local_178 = matrix;
  Gudhi::persistence_matrix::
  Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
  ::
  Naive_vector_column<std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>>
            ((Naive_vector_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>,std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)4,true,true,true>>>*>>>
              *)local_210,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var1 = &(rows->_M_t)._M_impl.super__Rb_tree_header;
  p_Var17 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_180 = rows;
  IVar8 = local_210._0_4_;
  IVar9 = local_1f8;
  local_1a8 = local_1f0;
  ppEStack_1a0 = ppEStack_1e8;
  local_198 = local_1e0;
  while ((_Rb_tree_header *)p_Var17 != p_Var1) {
    local_210._0_4_ = IVar8;
    local_1f8 = IVar9;
    local_1f0 = local_1a8;
    ppEStack_1e8 = ppEStack_1a0;
    local_1e0 = local_198;
    if (p_Var17[1]._M_parent != (_Base_ptr)&p_Var17[1]._M_parent &&
        p_Var17[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var17[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_120 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_118 = "";
        local_130 = &boost::unit_test::basic_cstring<char_const>::null;
        local_128 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x20d);
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001db440;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = (undefined4 **)0x1a71a4;
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2a8 = (undefined4 *)CONCAT44(local_2a8._4_4_,iVar3);
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,6);
        local_230 = (undefined **)CONCAT71(local_230._1_7_,iVar3 == 6);
        local_228 = (char *)0x0;
        sStack_220.pi_ = (sp_counted_base *)0x0;
        local_278 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_270 = "";
        local_240 = &local_2a8;
        local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
        local_1c8._0_8_ = &PTR__lazy_ostream_001db900;
        local_1c8._16_8_ = &boost::unit_test::lazy_ostream::inst;
        local_1b0 = &local_240;
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001db940;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_230,&local_298,&local_278,0x20d,1,2,2,"entry.get_column_index()",local_1c8
                   ,"6",&local_260);
        boost::detail::shared_count::~shared_count(&sStack_220);
      }
    }
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    IVar8 = local_210._0_4_;
    IVar9 = local_1f8;
    local_1a8 = local_1f0;
    ppEStack_1a0 = ppEStack_1e8;
    local_198 = local_1e0;
  }
  local_210._0_4_ = 0;
  local_1c8._4_4_ = (undefined4)((ulong)local_1c8._0_8_ >> 0x20);
  local_1c8._0_4_ = IVar8;
  psStack_200 = (pointer)0xffffffffffffffff;
  local_1f8 = 0xffffffff;
  local_1b0._4_4_ = (undefined4)((ulong)local_1b0 >> 0x20);
  local_1b0 = (undefined4 ***)CONCAT44(local_1b0._4_4_,IVar9);
  local_1f0 = (pointer)0x0;
  ppEStack_1e8 = (pointer)0x0;
  local_1e0 = (pointer)0x0;
  uStack_190 = (undefined4)uStack_1d8;
  uStack_1d8._4_4_ = (undefined4)((ulong)uStack_1d8 >> 0x20);
  uStack_18c = uStack_1d8._4_4_;
  uStack_1d8 = (Field_operators *)0x0;
  pEStack_1d0 = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8._8_8_ = local_210._8_8_;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001db440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)((long)ppEStack_1a0 - (long)local_1a8 >> 3);
  local_2a0 = &local_2b0;
  local_2a8 = &local_2b4;
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a789e;
  local_238 = "";
  local_248 = &local_2a0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001db940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_278._0_1_ = (long)ppEStack_1a0 - (long)local_1a8 == 0x20;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_2b0 = (undefined *)((long)ppEStack_1e8 - (long)local_1f0 >> 3);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001db440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_278 = (char *)CONCAT71(local_278._1_7_,ppEStack_1e8 == local_1f0);
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a789e;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001db940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x21d,1,2,2,"col.size()",&local_260,"0",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar16 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
                       *)local_1c8);
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar16);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b1974;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db3b0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  p_Var17 = (local_180->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  IVar8 = local_210._0_4_;
  IVar9 = local_1f8;
  while ((_Rb_tree_header *)p_Var17 != p_Var1) {
    local_210._0_4_ = IVar8;
    local_1f8 = IVar9;
    if (p_Var17[1]._M_parent != (_Base_ptr)&p_Var17[1]._M_parent &&
        p_Var17[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var17[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x225,
                   &local_150);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001db440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar3);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar3 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a789e;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001db900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001db940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x225,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    IVar8 = local_210._0_4_;
    IVar9 = local_1f8;
  }
  local_210._0_4_ = local_1c8._0_4_;
  local_1c8._4_4_ = (undefined4)((ulong)local_1c8._0_8_ >> 0x20);
  local_1c8._0_4_ = IVar8;
  local_1f8 = (Index)local_1b0;
  local_1b0 = (undefined4 ***)CONCAT44(local_1b0._4_4_,IVar9);
  uVar10 = (undefined4)uStack_1d8;
  uStack_1d8._4_4_ = (undefined4)((ulong)uStack_1d8 >> 0x20);
  uVar11 = uStack_1d8._4_4_;
  uStack_1d8 = (Field_operators *)CONCAT44(uStack_18c,uStack_190);
  uStack_190 = uVar10;
  uStack_18c = uVar11;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  psVar12 = (pointer)local_1c8._8_8_;
  ppEVar13 = local_1a8;
  ppEVar14 = ppEStack_1a0;
  ppEVar15 = local_198;
  local_1c8._8_8_ = local_210._8_8_;
  local_1c8._16_8_ = psStack_200;
  local_1a8 = local_1f0;
  ppEStack_1a0 = ppEStack_1e8;
  local_198 = local_1e0;
  pEStack_188 = pEStack_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_1e0 = ppEVar15;
  ppEStack_1e8 = ppEVar14;
  local_1f0 = ppEVar13;
  local_210._8_8_ = psVar12;
  local_2b0 = (undefined *)((long)ppEStack_1a0 - (long)local_1a8 >> 3);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001db440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b4 = 0;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a789e;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001db940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  local_278._0_1_ = ppEStack_1a0 == local_1a8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
  local_230 = &PTR__lazy_ostream_001db440;
  sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_218 = "";
  local_2b0 = (undefined *)((long)ppEStack_1e8 - (long)local_1f0 >> 3);
  local_278 = (char *)CONCAT71(local_278._1_7_,(long)ppEStack_1e8 - (long)local_1f0 == 0x20);
  local_2b4 = 4;
  local_270 = (char *)0x0;
  sStack_268.pi_ = (sp_counted_base *)0x0;
  local_240 = (undefined4 **)0x1a789e;
  local_238 = "";
  local_2a0 = &local_2b0;
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db400;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_248 = &local_2a0;
  local_2a8 = &local_2b4;
  local_290 = local_290 & 0xffffffffffffff00;
  local_298 = &PTR__lazy_ostream_001db940;
  sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_280 = &local_2a8;
  boost::test_tools::tt_detail::report_assertion
            (&local_278,&local_230,&local_240,0x235,1,2,2,"col.size()",&local_260,"4",&local_298);
  boost::detail::shared_count::~shared_count(&sStack_268);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar16 = Gudhi::persistence_matrix::operator==
                     ((local_178->
                      super__Vector_base<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>,_std::allocator<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
                      (Naive_vector_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
                       *)local_210);
  local_298 = (undefined **)CONCAT71(local_298._1_7_,bVar16);
  local_290 = 0;
  sStack_288.pi_ = (sp_counted_base *)0x0;
  local_230 = (undefined **)0x1b1989;
  local_228 = "";
  local_258 = 0;
  local_260 = &PTR__lazy_ostream_001db3b0;
  local_250 = &boost::unit_test::lazy_ostream::inst;
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_248 = &local_230;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_288);
  p_Var17 = (local_180->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  ppEVar13 = ppEStack_1a0;
  while (ppEStack_1a0 = ppEVar13, ppEVar14 = local_1a8, (_Rb_tree_header *)p_Var17 != p_Var1) {
    if (p_Var17[1]._M_parent != (_Base_ptr)&p_Var17[1]._M_parent &&
        p_Var17[1]._M_parent != (_Base_ptr)0x0) {
      p_Var4 = p_Var17[1]._M_left;
      uVar2 = *(uint *)&p_Var4->_M_left;
      if ((uVar2 < 6) && ((0x2bU >> (uVar2 & 0x1f) & 1) != 0)) {
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_170 = &boost::unit_test::basic_cstring<char_const>::null;
        local_168 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x23d,
                   &local_170);
        local_228 = (char *)((ulong)local_228 & 0xffffffffffffff00);
        local_230 = &PTR__lazy_ostream_001db440;
        sStack_220.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_218 = "";
        iVar3 = *(int *)&p_Var4[-1]._M_right;
        local_2b0 = (undefined *)CONCAT44(local_2b0._4_4_,iVar3);
        local_2b4 = 6;
        local_278 = (char *)CONCAT71(local_278._1_7_,iVar3 == 6);
        local_270 = (char *)0x0;
        sStack_268.pi_ = (sp_counted_base *)0x0;
        local_240 = (undefined4 **)0x1a789e;
        local_238 = "";
        local_2a0 = &local_2b0;
        local_258 = 0;
        local_260 = &PTR__lazy_ostream_001db900;
        local_250 = &boost::unit_test::lazy_ostream::inst;
        local_248 = &local_2a0;
        local_2a8 = &local_2b4;
        local_290 = local_290 & 0xffffffffffffff00;
        local_298 = &PTR__lazy_ostream_001db940;
        sStack_288.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
        local_280 = &local_2a8;
        boost::test_tools::tt_detail::report_assertion
                  (&local_278,&local_230,&local_240,0x23d,1,2,2,"entry.get_column_index()",
                   &local_260,"6",&local_298);
        boost::detail::shared_count::~shared_count(&sStack_268);
      }
    }
    p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    ppEVar13 = ppEStack_1a0;
  }
  for (; ppEVar14 != ppEVar13; ppEVar14 = ppEVar14 + 1) {
    pEVar5 = *ppEVar14;
    if ((((pointer)local_1c8._8_8_ != (pointer)0x0) ||
        (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
                    *)0x0)) &&
       (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar6 != (node_ptr)0x0)) {
      plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar7->next_ = plVar6;
      plVar6->prev_ = plVar7;
    }
    operator_delete(pEVar5,0x20);
  }
  ppEVar13 = local_1f0;
  if (local_1a8 != (pointer)0x0) {
    operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
    ppEVar13 = local_1f0;
  }
  for (; ppEVar13 != ppEStack_1e8; ppEVar13 = ppEVar13 + 1) {
    pEVar5 = *ppEVar13;
    if ((((pointer)local_210._8_8_ != (pointer)0x0) ||
        (pEVar5 != (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>
                    *)0x0)) &&
       (plVar6 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
       plVar6 != (node_ptr)0x0)) {
      plVar7 = (pEVar5->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
      plVar7->next_ = plVar6;
      plVar6->prev_ = plVar7;
    }
    operator_delete(pEVar5,0x20);
  }
  if (local_1f0 != (pointer)0x0) {
    operator_delete(local_1f0,(long)local_1e0 - (long)local_1f0);
  }
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}